

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O2

int pfr_cmp(void *av,void *bv)

{
  int iVar1;
  uint uVar2;
  
  if (*(int *)((long)bv + 4) < *(int *)((long)av + 4)) {
    return 1;
  }
  if (*(int *)((long)av + 4) < *(int *)((long)bv + 4)) {
    return -1;
  }
  if (*(int *)((long)bv + 0x38) < *(int *)((long)av + 0x38)) {
    return 1;
  }
  if (*(int *)((long)av + 0x38) < *(int *)((long)bv + 0x38)) {
    return -1;
  }
  iVar1 = nullstrcmp(*(char **)((long)av + 0x10),*(char **)((long)bv + 0x10));
  if (iVar1 == 0) {
    if (*(uint *)((long)bv + 8) < *(uint *)((long)av + 8)) {
      return 1;
    }
    if (*(uint *)((long)av + 8) < *(uint *)((long)bv + 8)) {
      return -1;
    }
    if (*(int *)((long)av + 4) != 0x44) {
      iVar1 = nullstrcmp(*(char **)((long)av + 0x18),*(char **)((long)bv + 0x18));
      if (iVar1 != 0) goto LAB_0011fc87;
      if (*(uint *)((long)bv + 0xc) < *(uint *)((long)av + 0xc)) {
        return 1;
      }
      if (*(uint *)((long)av + 0xc) < *(uint *)((long)bv + 0xc)) {
        return -1;
      }
    }
    uVar2 = 0;
  }
  else {
LAB_0011fc87:
    uVar2 = iVar1 >> 0x1f | 1;
  }
  return uVar2;
}

Assistant:

static int pfr_cmp(void *av, void *bv)
{
    PortFwdRecord *a = (PortFwdRecord *) av;
    PortFwdRecord *b = (PortFwdRecord *) bv;
    int i;
    if (a->type > b->type)
        return +1;
    if (a->type < b->type)
        return -1;
    if (a->addressfamily > b->addressfamily)
        return +1;
    if (a->addressfamily < b->addressfamily)
        return -1;
    if ( (i = nullstrcmp(a->saddr, b->saddr)) != 0)
        return i < 0 ? -1 : +1;
    if (a->sport > b->sport)
        return +1;
    if (a->sport < b->sport)
        return -1;
    if (a->type != 'D') {
        if ( (i = nullstrcmp(a->daddr, b->daddr)) != 0)
            return i < 0 ? -1 : +1;
        if (a->dport > b->dport)
            return +1;
        if (a->dport < b->dport)
            return -1;
    }
    return 0;
}